

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdAddTxSign(void *handle,int net_type,char *tx_hex_string,char *txid,uint32_t vout,
                int hash_type,char *sign_data_hex,bool use_der_encode,int sighash_type,
                bool sighash_anyone_can_pay,bool clear_stack,char **tx_string)

{
  pointer *ppuVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  AddressType AVar4;
  size_t sVar5;
  char *pcVar6;
  CfdException *pCVar7;
  uint uVar8;
  OutPoint outpoint;
  TransactionContext tx;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_list;
  SignParameter param;
  allocator local_1ea;
  bool local_1e9;
  string local_1e8;
  void *local_1c8;
  uint32_t local_1bc;
  OutPoint local_1b8;
  undefined1 local_190 [104];
  char local_128 [80];
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_d8;
  SigHashType local_c0;
  SigHashType local_b4;
  SignParameter local_a8;
  
  local_1c8 = handle;
  local_1bc = vout;
  cfd::Initialize();
  bVar3 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar3) {
    local_190._0_8_ = "cfdcapi_transaction.cpp";
    local_190._8_4_ = 0x614;
    local_190._16_8_ = "CfdAddTxSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_190,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_190._0_8_ = local_190 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_190,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_190);
    __cxa_throw(pCVar7,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar3 = cfd::capi::IsEmptyString(txid);
  if (bVar3) {
    local_190._0_8_ = "cfdcapi_transaction.cpp";
    local_190._8_4_ = 0x61a;
    local_190._16_8_ = "CfdAddTxSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_190,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_190._0_8_ = local_190 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_190,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_190);
    __cxa_throw(pCVar7,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (tx_string == (char **)0x0) {
    local_190._0_8_ = "cfdcapi_transaction.cpp";
    local_190._8_4_ = 0x620;
    local_190._16_8_ = "CfdAddTxSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_190,kCfdLogLevelWarning,"tx output is null.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_190._0_8_ = local_190 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_190,"Failed to parameter. tx output is null.","");
    cfd::core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_190);
    __cxa_throw(pCVar7,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  AVar4 = cfd::capi::ConvertHashToAddressType(0);
  if (sign_data_hex == (char *)0x0) {
LAB_00429a57:
    local_190._0_8_ = "cfdcapi_transaction.cpp";
    local_190._8_4_ = 0x62f;
    local_190._16_8_ = "CfdAddTxSign";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_190,kCfdLogLevelWarning,"sign data is null or empty.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    local_190._0_8_ = local_190 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_190,"Failed to parameter. sign data is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_190);
    __cxa_throw(pCVar7,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar3 = cfd::capi::IsEmptyString(sign_data_hex);
  uVar8 = AVar4 - kP2wshAddress;
  if ((0xfffffffd < uVar8 || use_der_encode) && bVar3) goto LAB_00429a57;
  cfd::SignParameter::SignParameter(&local_a8);
  if (use_der_encode) {
    cfd::core::SigHashType::Create
              ((SigHashType *)&local_1e8,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
    local_190._0_8_ = local_190 + 0x10;
    sVar5 = strlen(sign_data_hex);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_190,sign_data_hex,sign_data_hex + sVar5);
    cfd::core::ByteData::ByteData((ByteData *)&local_1b8,(string *)local_190);
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_);
    }
    cfd::core::SigHashType::SigHashType(&local_b4,(SigHashType *)&local_1e8);
    cfd::SignParameter::SignParameter
              ((SignParameter *)local_190,(ByteData *)&local_1b8,true,&local_b4);
    cfd::SignParameter::operator=(&local_a8,(SignParameter *)local_190);
    local_190._72_8_ = &PTR__ScriptOperator_00722da0;
    if ((char *)local_190._88_8_ != local_128) {
      operator_delete((void *)local_190._88_8_);
    }
    if ((pointer)local_190._32_8_ != (pointer)0x0) {
      operator_delete((void *)local_190._32_8_);
    }
    if ((pointer)local_190._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_190._0_8_);
    }
    if (local_1b8.txid_._vptr_Txid == (_func_int **)0x0) goto LAB_0042980d;
  }
  else {
    ppuVar1 = (pointer *)
              ((long)&local_1b8.txid_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8)
    ;
    local_1b8.txid_._vptr_Txid = (_func_int **)ppuVar1;
    sVar5 = strlen(sign_data_hex);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,sign_data_hex,sign_data_hex + sVar5);
    cfd::core::SigHashType::SigHashType(&local_c0,kSigHashAll,false,false);
    cfd::SignParameter::SignParameter
              ((SignParameter *)local_190,(string *)&local_1b8,false,&local_c0);
    cfd::SignParameter::operator=(&local_a8,(SignParameter *)local_190);
    local_190._72_8_ = &PTR__ScriptOperator_00722da0;
    if ((char *)local_190._88_8_ != local_128) {
      operator_delete((void *)local_190._88_8_);
    }
    if ((pointer)local_190._32_8_ != (pointer)0x0) {
      operator_delete((void *)local_190._32_8_);
    }
    if ((pointer)local_190._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_190._0_8_);
    }
    if (local_1b8.txid_._vptr_Txid == (_func_int **)ppuVar1) goto LAB_0042980d;
  }
  operator_delete(local_1b8.txid_._vptr_Txid);
LAB_0042980d:
  local_d8.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
            (&local_d8,&local_a8);
  local_1e9 = false;
  cfd::capi::ConvertNetType(net_type,&local_1e9);
  std::__cxx11::string::string((string *)&local_1e8,txid,&local_1ea);
  cfd::core::Txid::Txid((Txid *)local_190,&local_1e8);
  cfd::core::OutPoint::OutPoint(&local_1b8,(Txid *)local_190,local_1bc);
  local_190._0_8_ = &PTR__Txid_00723450;
  if ((void *)CONCAT44(local_190._12_4_,local_190._8_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_190._12_4_,local_190._8_4_));
  }
  paVar2 = &local_1e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if (local_1e9 == true) {
    std::__cxx11::string::string((string *)&local_1e8,tx_hex_string,&local_1ea);
    cfd::TransactionContext::TransactionContext((TransactionContext *)local_190,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    cfd::TransactionContext::AddSign
              ((TransactionContext *)local_190,&local_1b8,&local_d8,uVar8 < 0xfffffffe,clear_stack);
    cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_1e8,(AbstractTransaction *)local_190);
    pcVar6 = cfd::capi::CreateString(&local_1e8);
    *tx_string = pcVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    cfd::TransactionContext::~TransactionContext((TransactionContext *)local_190);
  }
  else {
    std::__cxx11::string::string((string *)&local_1e8,tx_hex_string,&local_1ea);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)local_190,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    cfd::ConfidentialTransactionContext::AddSign
              ((ConfidentialTransactionContext *)local_190,&local_1b8,&local_d8,uVar8 < 0xfffffffe,
               clear_stack);
    cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_1e8,(AbstractTransaction *)local_190);
    pcVar6 = cfd::capi::CreateString(&local_1e8);
    *tx_string = pcVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)local_190);
  }
  local_1b8.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
  if (local_1b8.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_d8);
  local_a8.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00722da0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.op_code_.text_data_._M_dataplus._M_p != &local_a8.op_code_.text_data_.field_2) {
    operator_delete(local_a8.op_code_.text_data_._M_dataplus._M_p);
  }
  if (local_a8.related_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.related_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdAddTxSign(
    void* handle, int net_type, const char* tx_hex_string, const char* txid,
    uint32_t vout, int hash_type, const char* sign_data_hex,
    bool use_der_encode, int sighash_type, bool sighash_anyone_can_pay,
    bool clear_stack, char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    bool is_witness = true;
    if ((addr_type == AddressType::kP2shAddress) ||
        (addr_type == AddressType::kP2pkhAddress)) {
      is_witness = false;
    }

    if ((sign_data_hex == nullptr) ||
        (IsEmptyString(sign_data_hex) && (use_der_encode || !is_witness))) {
      warn(CFD_LOG_SOURCE, "sign data is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sign data is null or empty.");
    }

    SignParameter param;
    if (use_der_encode) {
      // encode to der
      SigHashType sighashtype = SigHashType::Create(
          static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
      ByteData signature_bytes = ByteData(std::string(sign_data_hex));
      param = SignParameter(signature_bytes, true, sighashtype);
    } else {
      param = SignParameter(std::string(sign_data_hex));
    }
    std::vector<SignParameter> sign_list;
    sign_list.push_back(param);

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    OutPoint outpoint(Txid(txid), vout);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      tx.AddSign(outpoint, sign_list, is_witness, clear_stack);
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      tx.AddSign(outpoint, sign_list, is_witness, clear_stack);
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}